

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_x.hpp
# Opt level: O2

void ExchCXX::kernel_traits<ExchCXX::BuiltinSCAN_X>::eval_exc_vxc_unpolar_impl
               (double rho,double sigma,double lapl,double tau,double *eps,double *vrho,
               double *vsigma,double *vlapl,double *vtau)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double __x;
  double dVar32;
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  
  dVar3 = cbrt(1.0);
  dVar4 = cbrt(rho);
  dVar36 = rho * rho;
  dVar38 = 1.0 / (dVar4 * dVar4);
  dVar16 = dVar38 / dVar36;
  dVar34 = sigma * 1.5874010519681996 * dVar16;
  dVar17 = sigma * sigma;
  dVar18 = dVar36 * dVar36;
  dVar29 = 1.0 / dVar4;
  dVar5 = exp(dVar34 * -0.016238677546860578);
  dVar19 = (dVar29 / (dVar18 * rho)) * dVar5;
  dVar20 = dVar17 * 1.2599210498948732 * 0.01900177337214953;
  dVar30 = (dVar38 / (dVar36 * rho)) * sigma * 1.5874010519681996;
  dVar21 = 1.0 / (dVar4 * dVar4 * rho);
  dVar28 = dVar16 * 1.5874010519681996 * 0.3949273883044934;
  dVar6 = (tau * 1.5874010519681996 * dVar21 + dVar34 * -0.125) * 0.5555555555555556 *
          1.8171205928321397 * 0.21733691746289932;
  dVar14 = dVar28 * -0.06944444444444445;
  dVar22 = 1.0 - dVar6;
  dVar7 = exp(dVar22 * dVar22 * -0.5);
  uVar2 = (uint)(dVar6 < 0.9818308872650647);
  auVar43._0_8_ = CONCAT44((int)(uVar2 << 0x1f) >> 0x1f,(int)(uVar2 << 0x1f) >> 0x1f);
  auVar43._8_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
  auVar43._12_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
  dVar15 = (double)((ulong)dVar14 & auVar43._8_8_);
  dVar9 = (double)(~auVar43._0_8_ & 0x3fef6b289be0321a | (ulong)dVar6 & auVar43._0_8_);
  dVar8 = 1.0 - dVar9;
  dVar23 = 1.0 / dVar8;
  dVar31 = 1.0 / (dVar8 * dVar8);
  dVar9 = dVar9 * -0.667;
  dVar8 = exp(dVar9 * dVar23);
  dVar39 = (double)(-(ulong)(dVar6 < 1.0220636308242315) & 0xbf9697d93348cc40 |
                   ~-(ulong)(dVar6 < 1.0220636308242315) & (ulong)dVar22);
  dVar10 = exp(0.8 / dVar39);
  dVar24 = 0.0;
  if (1.0220636308242315 <= dVar6) {
    dVar24 = dVar10 * -1.24;
  }
  dVar25 = tau * 1.5874010519681996 * -1.6666666666666667 * dVar16 + dVar30 / 3.0;
  if (sigma < 0.0) {
    dVar26 = sqrt(sigma);
  }
  else {
    dVar26 = SQRT(sigma);
  }
  dVar11 = dVar34 * 0.002577429052762639 + (dVar22 * 12.083045973594572 * dVar7) / 100.0;
  dVar12 = dVar26 * 1.2599210498948732 * 1.5393389262365065;
  __x = (dVar29 / rho) * dVar12;
  if (__x < 0.0) {
    dVar27 = sqrt(__x);
  }
  else {
    dVar27 = SQRT(__x);
  }
  dVar13 = exp(-17.140028381540095 / dVar27);
  dVar35 = dVar21 * 1.5874010519681996 * 0.5555555555555556 * 0.3949273883044934;
  dVar41 = dVar35;
  if (0.9818308872650647 <= dVar6) {
    dVar41 = 0.0;
  }
  dVar37 = (dVar20 * dVar19) / 288.0 + dVar34 * 0.3949273883044934 * 0.0051440329218107 + 0.065 +
           dVar11 * dVar11;
  dVar32 = dVar25 * 1.8171205928321397 * 0.5555555555555556 * 0.21733691746289932;
  dVar34 = 0.0;
  if (dVar6 <= 0.9818308872650647) {
    dVar34 = (double)(-(ulong)(dVar6 < 0.9818308872650647) & (ulong)dVar32);
    dVar34 = (dVar34 * -0.667 * dVar23 + dVar34 * dVar31 * dVar9) * dVar8;
  }
  dVar46 = 0.0;
  if (dVar6 <= 0.9818308872650647) {
    dVar46 = (dVar41 * -0.667 * dVar23 + dVar31 * dVar9 * dVar41) * dVar8;
  }
  dVar41 = (1.0 / (dVar39 * dVar39)) * -0.992;
  dVar39 = 0.0;
  if (1.0220636308242315 <= dVar6) {
    dVar39 = (double)(~-(ulong)(dVar6 < 1.0220636308242315) & (ulong)dVar32) * dVar41 * dVar10;
  }
  dVar32 = (double)(~-(ulong)(dVar6 <= 1.0) & (ulong)dVar24 |
                   ~-(ulong)(0.9818308872650647 < dVar6) & (ulong)dVar8 & -(ulong)(dVar6 <= 1.0));
  dVar24 = 0.0;
  if (1.0220636308242315 <= dVar6) {
    dVar24 = dVar14;
  }
  dVar45 = (1.0 - 0.065 / dVar37) * 0.065 + 1.0;
  dVar44 = 1.0 - dVar32;
  dVar47 = 0.0;
  dVar14 = 0.0;
  if (1.0220636308242315 <= dVar6) {
    dVar47 = dVar24 * dVar41 * dVar10;
    dVar14 = dVar35;
  }
  dVar24 = 0.0;
  if (1.0220636308242315 <= dVar6) {
    dVar24 = dVar10 * dVar14 * dVar41;
  }
  dVar4 = dVar4 * dVar3 * 0.9847450218426964 * -0.375;
  dVar10 = dVar45 * dVar44 + dVar32 * 1.174;
  if (1.0 < dVar6) {
    dVar46 = dVar24;
    dVar34 = dVar39;
  }
  bVar1 = 1e-15 < rho * 0.5;
  dVar39 = 1.0 - dVar13;
  dVar14 = dVar22 * dVar22 * 12.083045973594572;
  dVar22 = 0.0042250000000000005 / (dVar37 * dVar37);
  dVar24 = dVar7 * 0.3949273883044934;
  auVar42._8_8_ = 1.0 / dVar27;
  auVar42._0_8_ = 0x3ff0000000000000;
  auVar33._8_8_ = __x;
  auVar33._0_8_ = dVar26;
  auVar43 = divpd(auVar42,auVar33);
  dVar26 = 0.0;
  if (bVar1) {
    dVar26 = auVar43._8_8_ * (1.0 / dVar36) * dVar10 * dVar3 * 2.4980495329668133 *
             -1.6891736332904388 * dVar12 * dVar13 +
             (dVar34 * 1.174 +
             ((((dVar25 * dVar14 * dVar24) / 180.0 +
               dVar30 * -0.006873144140700372 + (dVar25 * 12.083045973594572 * dVar24) / -180.0) *
               (dVar11 + dVar11) +
              dVar17 * sigma * 5.71414204831218e-06 * (1.0 / (dVar18 * dVar18 * rho)) * dVar5 +
              dVar30 * -0.005417385299101418 +
              (dVar20 * (dVar29 / (dVar18 * dVar36)) * dVar5) / -54.0) * dVar44 * dVar22 -
             dVar34 * dVar45)) * dVar4 * dVar39 +
             dVar38 * -(dVar3 * 0.9847450218426964) * dVar10 * dVar39 * 0.125;
  }
  dVar14 = dVar14 * 1.5874010519681996;
  dVar29 = dVar4 * dVar10 * dVar39;
  dVar20 = 0.0;
  if (bVar1) {
    dVar6 = (double)(-(ulong)(dVar6 <= 1.0) &
                     ~-(ulong)(0.9818308872650647 < dVar6) &
                     (ulong)(dVar8 * (dVar15 * -0.667 * dVar23 + dVar31 * dVar15 * dVar9)) |
                    ~-(ulong)(dVar6 <= 1.0) & (ulong)dVar47);
    dVar20 = (dVar6 * 1.174 +
             (((dVar11 + dVar11) *
               ((dVar16 * 0.004091413589728813 + (dVar24 * dVar16 * 19.180639889464143) / 1440.0) -
               (dVar16 * dVar14 * 1.8171205928321397 * dVar7 * 0.21733691746289932) / 1440.0) +
              dVar17 * -2.1428032681170676e-06 * (1.0 / (dVar18 * dVar18)) * dVar5 +
              dVar28 * 0.0051440329218107 +
              (sigma * 1.2599210498948732 * 0.01900177337214953 * dVar19) / 144.0) * dVar44 * dVar22
             - dVar6 * dVar45)) * dVar4 * dVar39 +
             auVar43._8_8_ * dVar3 * 2.4980495329668133 * (1.0 / rho) * dVar10 * 0.6334401124839145
             * dVar13 * auVar43._0_8_ * 1.5393389262365065 * 1.2599210498948732;
  }
  dVar3 = 0.0;
  if (bVar1) {
    auVar40._0_8_ = dVar7 * 0.21733691746289932 * dVar14 * dVar21 * 1.8171205928321397;
    auVar40._8_8_ = dVar24 * dVar21 * 19.180639889464143;
    auVar43 = divpd(auVar40,_DAT_01002a30);
    dVar3 = dVar39 * dVar4 * (dVar46 * 1.174 +
                             ((dVar22 + dVar22) * dVar11 * (auVar43._0_8_ - auVar43._8_8_) * dVar44
                             - dVar45 * dVar46));
  }
  dVar5 = (double)(~-(ulong)(rho * 0.5 <= 1e-15) & (ulong)(dVar29 + dVar29));
  *eps = dVar5;
  dVar4 = rho + rho;
  *vrho = dVar26 * dVar4 + dVar5;
  *vsigma = dVar20 * dVar4;
  *vlapl = 0.0;
  *vtau = dVar4 * dVar3;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double sigma, double lapl, double tau, double& eps, double& vrho, double& vsigma, double& vlapl, double& vtau ) {

    (void)(lapl);
    (void)(eps);
    constexpr double t4 = constants::m_cbrt_3;
    constexpr double t5 = constants::m_cbrt_pi;
    constexpr double t21 = constants::m_cbrt_6;
    constexpr double t22 = constants::m_pi_sq;
    constexpr double t23 = constants::m_cbrt_pi_sq;
    constexpr double t27 = constants::m_cbrt_2;
    constexpr double t24 = t23 * t23;
    constexpr double t25 = 0.1e1 / t24;
    constexpr double t26 = t21 * t25;
    constexpr double t28 = t27 * t27;
    constexpr double t39 = 0.1e3 / 0.6561e4 / k1 - 0.73e2 / 0.648e3;
    constexpr double t40 = t21 * t21;
    constexpr double t42 = t23 * t22;
    constexpr double t43 = 0.1e1 / t42;
    constexpr double t44 = t39 * t40 * t43;
    constexpr double t125 = 0.1e1 / t23;
    constexpr double t126 = t40 * t125;
    constexpr double t148 = k1 * k1;
    constexpr double t165 = t39 * t39;
    constexpr double t166 = t22 * t22;
    constexpr double t167 = 0.1e1 / t166;
    constexpr double t168 = t165 * t167;
    constexpr double t210 = d * c2;
    constexpr double t257 = t25 * t28;


    const double t3 = rho / 0.2e1 <= dens_tol;
    const double t8 = 0.1e1 <= zeta_tol;
    const double t9 = zeta_tol - 0.1e1;
    const double t11 = piecewise_functor_5( t8, t9, t8, -t9, 0.0 );
    const double t12 = 0.1e1 + t11;
    const double t14 = safe_math::cbrt( zeta_tol );
    const double t16 = safe_math::cbrt( t12 );
    const double t18 = piecewise_functor_3( t12 <= zeta_tol, t14 * zeta_tol, t16 * t12 );
    const double t19 = t4 / t5 * t18;
    const double t20 = safe_math::cbrt( rho );
    const double t29 = sigma * t28;
    const double t30 = rho * rho;
    const double t31 = t20 * t20;
    const double t33 = 0.1e1 / t31 / t30;
    const double t34 = t29 * t33;
    const double t35 = t26 * t34;
    const double t45 = sigma * sigma;
    const double t46 = t45 * t27;
    const double t47 = t30 * t30;
    const double t48 = t47 * rho;
    const double t50 = 0.1e1 / t20 / t48;
    const double t55 = safe_math::exp( -0.27e2 / 0.8e2 * t39 * t21 * t25 * t34 );
    const double t56 = t50 * t55;
    const double t60 = safe_math::sqrt( 0.146e3 );
    const double t61 = t60 * t21;
    const double t62 = t61 * t25;
    const double t65 = tau * t28;
    const double t66 = t31 * rho;
    const double t67 = 0.1e1 / t66;
    const double t73 = 0.5e1 / 0.9e1 * ( t65 * t67 - t34 / 0.8e1 ) * t21 * t25;
    const double t74 = 0.1e1 - t73;
    const double t76 = t74 * t74;
    const double t78 = safe_math::exp( -t76 / 0.2e1 );
    const double t81 = 0.7e1 / 0.1296e5 * t62 * t34 + t60 * t74 * t78 / 0.1e3;
    const double t82 = t81 * t81;
    const double t83 = k1 + 0.5e1 / 0.972e3 * t35 + t44 * t46 * t56 / 0.288e3 + t82;
    const double t88 = 0.1e1 + k1 * ( 0.1e1 - k1 / t83 );
    const double t89 = t73 <= 0.1e1;
    const double t90 = safe_math::log( DBL_EPSILON );
    const double t93 = t90 / ( -t90 + c1 );
    const double t94 = -t93 < t73;
    const double t95 = t73 < -t93;
    const double t96 = piecewise_functor_3( t95, t73, -t93 );
    const double t97 = c1 * t96;
    const double t98 = 0.1e1 - t96;
    const double t99 = 0.1e1 / t98;
    const double t101 = safe_math::exp( -t97 * t99 );
    const double t102 = piecewise_functor_3( t94, 0.0, t101 );
    const double t103 = fabs( d );
    const double t106 = safe_math::log( DBL_EPSILON / t103 );
    const double t109 = ( -t106 + c2 ) / t106;
    const double t110 = t73 < -t109;
    const double t111 = piecewise_functor_3( t110, -t109, t73 );
    const double t112 = 0.1e1 - t111;
    const double t115 = safe_math::exp( c2 / t112 );
    const double t117 = piecewise_functor_3( t110, 0.0, -d * t115 );
    const double t118 = piecewise_functor_3( t89, t102, t117 );
    const double t119 = 0.1e1 - t118;
    const double t122 = t88 * t119 + 0.1174e1 * t118;
    const double t124 = safe_math::sqrt( 0.3e1 );
    const double t127 = safe_math::sqrt( sigma );
    const double t128 = t127 * t27;
    const double t130 = 0.1e1 / t20 / rho;
    const double t132 = t126 * t128 * t130;
    const double t133 = safe_math::sqrt( t132 );
    const double t137 = safe_math::exp( -0.98958e1 * t124 / t133 );
    const double t138 = 0.1e1 - t137;
    const double t142 = piecewise_functor_3( t3, 0.0, -0.3e1 / 0.8e1 * t19 * t20 * t122 * t138 );
    const double t143 = 0.1e1 / t31;
    const double t149 = t83 * t83;
    const double t151 = t148 / t149;
    const double t152 = t30 * rho;
    const double t154 = 0.1e1 / t31 / t152;
    const double t155 = t29 * t154;
    const double t158 = t47 * t30;
    const double t160 = 0.1e1 / t20 / t158;
    const double t161 = t160 * t55;
    const double t169 = t45 * sigma;
    const double t170 = t47 * t47;
    const double t171 = t170 * rho;
    const double t172 = 0.1e1 / t171;
    const double t182 = -0.5e1 / 0.3e1 * t65 * t33 + t155 / 0.3e1;
    const double t184 = t26 * t78;
    const double t187 = t60 * t76;
    const double t191 = -0.7e1 / 0.486e4 * t62 * t155 - t60 * t182 * t184 / 0.18e3 + t187 * t182 * t184 / 0.18e3;
    const double t194 = -0.1e2 / 0.729e3 * t26 * t155 - t44 * t46 * t161 / 0.54e2 + 0.3e1 / 0.8e2 * t168 * t169 * t172 * t55 + 0.2e1 * t81 * t191;
    const double t195 = t194 * t119;
    const double t197 = t182 * t21;
    const double t199 = 0.5e1 / 0.9e1 * t197 * t25;
    const double t200 = piecewise_functor_3( t95, t199, 0.0 );
    const double t203 = t98 * t98;
    const double t204 = 0.1e1 / t203;
    const double t205 = t204 * t200;
    const double t207 = -c1 * t200 * t99 - t97 * t205;
    const double t208 = t207 * t101;
    const double t209 = piecewise_functor_3( t94, 0.0, t208 );
    const double t211 = t112 * t112;
    const double t212 = 0.1e1 / t211;
    const double t213 = piecewise_functor_3( t110, 0.0, t199 );
    const double t217 = piecewise_functor_3( t110, 0.0, -t210 * t212 * t213 * t115 );
    const double t218 = piecewise_functor_3( t89, t209, t217 );
    const double t221 = t151 * t195 - t88 * t218 + 0.1174e1 * t218;
    const double t226 = safe_math::pow( 0.3e1, 0.1e1 / 0.6e1 );
    const double t227 = t226 * t226;
    const double t228 = t227 * t227;
    const double t230 = t228 * t226 * t18;
    const double t231 = 0.1e1 / t30;
    const double t232 = t231 * t122;
    const double t234 = 0.1e1 / t133 / t132;
    const double t236 = t230 * t232 * t234;
    const double t238 = t126 * t128 * t137;
    const double t242 = piecewise_functor_3( t3, 0.0, -t19 * t143 * t122 * t138 / 0.8e1 - 0.3e1 / 0.8e1 * t19 * t20 * t221 * t138 - 0.16891736332904387511e1 * t236 * t238 );
    const double t245 = t28 * t33;
    const double t246 = t245 * t26;
    const double t248 = sigma * t27;
    const double t252 = 0.1e1 / t170;
    const double t261 = t60 * t28;
    const double t262 = t261 * t33;
    const double t263 = t262 * t184;
    const double t265 = t187 * t28;
    const double t267 = t25 * t78;
    const double t269 = t265 * t33 * t21 * t267;
    const double t271 = 0.7e1 / 0.1296e5 * t61 * t257 * t33 + t263 / 0.144e4 - t269 / 0.144e4;
    const double t274 = 0.5e1 / 0.972e3 * t246 + t44 * t248 * t56 / 0.144e3 - 0.9e1 / 0.64e3 * t168 * t45 * t252 * t55 + 0.2e1 * t81 * t271;
    const double t275 = t274 * t119;
    const double t277 = 0.5e1 / 0.72e2 * t246;
    const double t278 = piecewise_functor_3( t95, -t277, 0.0 );
    const double t279 = c1 * t278;
    const double t281 = t204 * t278;
    const double t283 = -t279 * t99 - t97 * t281;
    const double t284 = t283 * t101;
    const double t285 = piecewise_functor_3( t94, 0.0, t284 );
    const double t286 = piecewise_functor_3( t110, 0.0, -t277 );
    const double t290 = piecewise_functor_3( t110, 0.0, -t210 * t212 * t286 * t115 );
    const double t291 = piecewise_functor_3( t89, t285, t290 );
    const double t294 = t151 * t275 - t88 * t291 + 0.1174e1 * t291;
    const double t299 = 0.1e1 / rho;
    const double t300 = t299 * t122;
    const double t302 = t230 * t300 * t234;
    const double t303 = 0.1e1 / t127;
    const double t306 = t126 * t303 * t27 * t137;
    const double t310 = piecewise_functor_3( t3, 0.0, -0.3e1 / 0.8e1 * t19 * t20 * t294 * t138 + 0.63344011248391453166e0 * t302 * t306 );
    const double t312 = t261 * t67;
    const double t318 = t265 * t67 * t21 * t267 / 0.18e3 - t312 * t184 / 0.18e3;
    const double t319 = t81 * t318;
    const double t323 = t28 * t67;
    const double t325 = 0.5e1 / 0.9e1 * t323 * t26;
    const double t326 = piecewise_functor_3( t95, t325, 0.0 );
    const double t327 = c1 * t326;
    const double t331 = -t97 * t204 * t326 - t327 * t99;
    const double t332 = t331 * t101;
    const double t333 = piecewise_functor_3( t94, 0.0, t332 );
    const double t334 = piecewise_functor_3( t110, 0.0, t325 );
    const double t338 = piecewise_functor_3( t110, 0.0, -t210 * t212 * t334 * t115 );
    const double t339 = piecewise_functor_3( t89, t333, t338 );
    const double t342 = 0.2e1 * t151 * t319 * t119 - t88 * t339 + 0.1174e1 * t339;
    const double t347 = piecewise_functor_3( t3, 0.0, -0.3e1 / 0.8e1 * t19 * t20 * t342 * t138 );


    eps = 0.2e1 * t142;
    vrho = 0.2e1 * rho * t242 + 0.2e1 * t142;
    vsigma = 0.2e1 * rho * t310;
    vlapl = 0.e0;
    vtau = 0.2e1 * rho * t347;

  }